

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

int __thiscall ImDrawList::_CalcCircleAutoSegmentCount(ImDrawList *this,float radius)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  
  if ((int)(radius + 0.999999) < 0x40) {
    return (int)this->_Data->CircleSegmentCounts[(int)(radius + 0.999999)];
  }
  fVar3 = this->_Data->CircleSegmentMaxError;
  if (radius <= fVar3) {
    fVar3 = radius;
  }
  fVar3 = acosf(1.0 - fVar3 / radius);
  fVar3 = ceilf(3.1415927 / fVar3);
  uVar2 = ((int)fVar3 - ((int)fVar3 + 1 >> 0x1f)) + 1U & 0xfffffffe;
  if (0x1ff < (int)uVar2) {
    uVar2 = 0x200;
  }
  uVar1 = 4;
  if (4 < (int)uVar2) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

int ImDrawList::_CalcCircleAutoSegmentCount(float radius) const
{
    // Automatic segment count
    const int radius_idx = (int)(radius + 0.999999f); // ceil to never reduce accuracy
    if (radius_idx < IM_ARRAYSIZE(_Data->CircleSegmentCounts))
        return _Data->CircleSegmentCounts[radius_idx]; // Use cached value
    else
        return IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, _Data->CircleSegmentMaxError);
}